

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deStringUtil.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* de::splitString(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *__return_storage_ptr__,string *s,char delim)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  istream *piVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ret;
  string token;
  istringstream tokenStream;
  value_type local_228;
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  local_208;
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  local_1d8;
  istringstream local_1a8 [120];
  ios_base local_130 [264];
  
  std::__cxx11::istringstream::istringstream(local_1a8,(string *)s,_S_in);
  if (delim == '\0') {
    std::
    istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
    ::istream_iterator(&local_1d8,(istream_type *)local_1a8);
    paVar1 = &local_208._M_value.field_2;
    local_208._M_stream = (istream_type *)0x0;
    local_208._M_value._M_string_length = 0;
    local_208._M_value.field_2._M_local_buf[0] = '\0';
    local_208._M_ok = false;
    local_208._M_value._M_dataplus._M_p = (pointer)paVar1;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    vector<std::istream_iterator<std::__cxx11::string,char,std::char_traits<char>,long>,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,&local_1d8,&local_208,(allocator_type *)&local_228);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_value._M_dataplus._M_p != paVar1) {
      operator_delete(local_208._M_value._M_dataplus._M_p,
                      CONCAT71(local_208._M_value.field_2._M_allocated_capacity._1_7_,
                               local_208._M_value.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_value._M_dataplus._M_p == &local_1d8._M_value.field_2) goto LAB_0033d306;
  }
  else {
    (__return_storage_ptr__->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_228._M_string_length = 0;
    local_228.field_2._M_local_buf[0] = '\0';
    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
    while (piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                              ((istream *)local_1a8,(string *)&local_228,delim),
          ((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,&local_228);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p == &local_228.field_2) goto LAB_0033d306;
    local_1d8._M_value.field_2._M_allocated_capacity =
         CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,local_228.field_2._M_local_buf[0]);
    local_1d8._M_value._M_dataplus._M_p = local_228._M_dataplus._M_p;
  }
  operator_delete(local_1d8._M_value._M_dataplus._M_p,
                  local_1d8._M_value.field_2._M_allocated_capacity + 1);
LAB_0033d306:
  std::__cxx11::istringstream::~istringstream(local_1a8);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

vector<string> splitString (const string& s, char delim)
{
	istringstream tokenStream(s);

	if (delim == '\0')
		return vector<string>(istream_iterator<string>(tokenStream),
							  istream_iterator<string>());
	else
	{
		vector<string>	ret;
		string			token;

		while (std::getline(tokenStream, token, delim))
			ret.push_back(token);

		return ret;
	}
}